

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

Node * __thiscall wasm::DataFlow::Graph::addNode(Graph *this,Node *node)

{
  __uniq_ptr_impl<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>.
  super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl =
       (tuple<wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>)
       (tuple<wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>)node;
  std::
  vector<std::unique_ptr<wasm::DataFlow::Node,std::default_delete<wasm::DataFlow::Node>>,std::allocator<std::unique_ptr<wasm::DataFlow::Node,std::default_delete<wasm::DataFlow::Node>>>>
  ::emplace_back<std::unique_ptr<wasm::DataFlow::Node,std::default_delete<wasm::DataFlow::Node>>>
            ((vector<std::unique_ptr<wasm::DataFlow::Node,std::default_delete<wasm::DataFlow::Node>>,std::allocator<std::unique_ptr<wasm::DataFlow::Node,std::default_delete<wasm::DataFlow::Node>>>>
              *)&this->nodes,
             (unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> *)
             &local_18);
  if ((_Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>)
      local_18._M_t.
      super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>.
      super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl != (Node *)0x0) {
    std::default_delete<wasm::DataFlow::Node>::operator()
              ((default_delete<wasm::DataFlow::Node> *)&local_18,
               (Node *)local_18._M_t.
                       super__Tuple_impl<0UL,_wasm::DataFlow::Node_*,_std::default_delete<wasm::DataFlow::Node>_>
                       .super__Head_base<0UL,_wasm::DataFlow::Node_*,_false>._M_head_impl);
  }
  return node;
}

Assistant:

Node* addNode(Node* node) {
    nodes.push_back(std::unique_ptr<Node>(node));
    return node;
  }